

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lex.c
# Opt level: O0

int lj_lex_setup(lua_State *L,LexState *ls)

{
  byte *pbVar1;
  TValue *pTVar2;
  GCstr *pGVar3;
  bool bVar4;
  uint local_b0;
  uint local_ac;
  uint local_a8;
  int header;
  LexState *ls_local;
  lua_State *L_local;
  
  bVar4 = false;
  ls->L = L;
  ls->fs = (FuncState *)0x0;
  ls->p = (char *)0x0;
  ls->pe = (char *)0x0;
  ls->vstack = (VarInfo *)0x0;
  ls->sizevstack = 0;
  ls->vtop = 0;
  ls->bcstack = (BCInsLine *)0x0;
  ls->sizebcstack = 0;
  ls->tok = 0;
  ls->lookahead = 0x121;
  ls->linenumber = 1;
  ls->lastline = 1;
  ls->endmark = 0;
  if (ls->p < ls->pe) {
    pbVar1 = (byte *)ls->p;
    ls->p = (char *)(pbVar1 + 1);
    local_a8 = (uint)*pbVar1;
  }
  else {
    local_a8 = lex_more(ls);
  }
  ls->c = local_a8;
  if ((((ls->c == 0xef) && (ls->p + 2 <= ls->pe)) && (*ls->p == -0x45)) && (ls->p[1] == -0x41)) {
    ls->p = ls->p + 2;
    if (ls->p < ls->pe) {
      pbVar1 = (byte *)ls->p;
      ls->p = (char *)(pbVar1 + 1);
      local_ac = (uint)*pbVar1;
    }
    else {
      local_ac = lex_more(ls);
    }
    ls->c = local_ac;
    bVar4 = true;
  }
  if (ls->c == 0x23) {
    do {
      if (ls->p < ls->pe) {
        pbVar1 = (byte *)ls->p;
        ls->p = (char *)(pbVar1 + 1);
        local_b0 = (uint)*pbVar1;
      }
      else {
        local_b0 = lex_more(ls);
      }
      ls->c = local_b0;
      if (ls->c == -1) {
        return 0;
      }
      bVar4 = true;
      if (ls->c != 10) {
        bVar4 = ls->c == 0xd;
      }
    } while (!bVar4);
    lex_newline(ls);
    bVar4 = true;
  }
  if (ls->c == 0x1b) {
    if (bVar4) {
      pTVar2 = L->top;
      L->top = pTVar2 + 1;
      pGVar3 = lj_err_str(L,LJ_ERR_BCBAD);
      pTVar2->u64 = (ulong)pGVar3 | 0xfffd800000000000;
      lj_err_throw(L,3);
    }
    L_local._4_4_ = 1;
  }
  else {
    L_local._4_4_ = 0;
  }
  return L_local._4_4_;
}

Assistant:

int lj_lex_setup(lua_State *L, LexState *ls)
{
  int header = 0;
  ls->L = L;
  ls->fs = NULL;
  ls->pe = ls->p = NULL;
  ls->vstack = NULL;
  ls->sizevstack = 0;
  ls->vtop = 0;
  ls->bcstack = NULL;
  ls->sizebcstack = 0;
  ls->tok = 0;
  ls->lookahead = TK_eof;  /* No look-ahead token. */
  ls->linenumber = 1;
  ls->lastline = 1;
  ls->endmark = 0;
  lex_next(ls);  /* Read-ahead first char. */
  if (ls->c == 0xef && ls->p + 2 <= ls->pe && (uint8_t)ls->p[0] == 0xbb &&
      (uint8_t)ls->p[1] == 0xbf) {  /* Skip UTF-8 BOM (if buffered). */
    ls->p += 2;
    lex_next(ls);
    header = 1;
  }
  if (ls->c == '#') {  /* Skip POSIX #! header line. */
    do {
      lex_next(ls);
      if (ls->c == LEX_EOF) return 0;
    } while (!lex_iseol(ls));
    lex_newline(ls);
    header = 1;
  }
  if (ls->c == LUA_SIGNATURE[0]) {  /* Bytecode dump. */
    if (header) {
      /*
      ** Loading bytecode with an extra header is disabled for security
      ** reasons. This may circumvent the usual check for bytecode vs.
      ** Lua code by looking at the first char. Since this is a potential
      ** security violation no attempt is made to echo the chunkname either.
      */
      setstrV(L, L->top++, lj_err_str(L, LJ_ERR_BCBAD));
      lj_err_throw(L, LUA_ERRSYNTAX);
    }
    return 1;
  }
  return 0;
}